

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_chi2_test<trng::powerlaw_dist<float>>(powerlaw_dist<float> *d)

{
  AssertionHandler *pAVar1;
  parameter_type P;
  StringRef capturedExpression;
  ExprLhs<bool> EVar2;
  reference pvVar3;
  reference pvVar4;
  AssertionHandler catchAssertionHandler;
  double c2_p;
  vector<double,_std::allocator<double>_> p;
  int bin;
  result_type x;
  int i_1;
  lcg64_shift R;
  int i;
  vector<int,_std::allocator<int>_> count;
  vector<float,_std::allocator<float>_> quantil;
  int N;
  result_type dp;
  int bins;
  undefined4 in_stack_fffffffffffffe68;
  Flags in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar5;
  lcg64_shift *in_stack_fffffffffffffe78;
  SourceLineInfo *this;
  powerlaw_dist<float> *in_stack_fffffffffffffe80;
  AssertionHandler *this_00;
  size_type in_stack_fffffffffffffe88;
  undefined1 *__n;
  result_type_conflict1 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  result_type_conflict1 in_stack_fffffffffffffe98;
  result_type_conflict1 in_stack_fffffffffffffe9c;
  AssertionHandler *this_01;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  undefined1 local_c9;
  undefined8 local_c8;
  int local_a4;
  result_type_conflict1 local_a0;
  int local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  result_type_conflict1 local_64;
  int local_60;
  undefined1 local_4d [29];
  vector<float,_std::allocator<float>_> local_30;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0x80;
  local_10 = 0x3c000000;
  local_14._0_1_ = true;
  local_14._1_1_ = true;
  local_14._2_2_ = 0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x31db2d);
  local_4d._1_4_ = 0;
  this_01 = (AssertionHandler *)local_4d;
  std::allocator<int>::allocator((allocator<int> *)0x31db4a);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
             ,(value_type_conflict3 *)in_stack_fffffffffffffe80,
             (allocator_type *)in_stack_fffffffffffffe78);
  std::allocator<int>::~allocator((allocator<int> *)0x31db78);
  for (local_60 = 1; local_60 < 0x80; local_60 = local_60 + 1) {
    in_stack_fffffffffffffe9c =
         trng::powerlaw_dist<float>::icdf
                   ((powerlaw_dist<float> *)in_stack_fffffffffffffe78,
                    (result_type_conflict1)
                    CONCAT13(in_stack_fffffffffffffe77,
                             CONCAT12(in_stack_fffffffffffffe76,in_stack_fffffffffffffe74)));
    local_64 = in_stack_fffffffffffffe9c;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))),
               (value_type_conflict5 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
              );
  }
  local_98 = trng::lcg64_shift::Default;
  uStack_90 = DAT_005526e8;
  P.a._4_4_ = in_stack_fffffffffffffe6c;
  P.a._0_4_ = in_stack_fffffffffffffe68;
  P.b._0_4_ = in_stack_fffffffffffffe70;
  P.b._4_2_ = in_stack_fffffffffffffe74;
  P.b._6_1_ = in_stack_fffffffffffffe76;
  P.b._7_1_ = in_stack_fffffffffffffe77;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)0x31dc67,P);
  for (local_9c = 0; local_9c < 10000; local_9c = local_9c + 1) {
    in_stack_fffffffffffffe98 =
         trng::powerlaw_dist<float>::operator()(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78)
    ;
    local_a4 = 0;
    local_a0 = in_stack_fffffffffffffe98;
    while( true ) {
      in_stack_fffffffffffffe94 = in_stack_fffffffffffffe94 & 0xffffff;
      if (local_a4 < 0x7f) {
        in_stack_fffffffffffffe90 = local_a0;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,(long)local_a4);
        in_stack_fffffffffffffe94 =
             CONCAT13(*pvVar3 <= in_stack_fffffffffffffe90 && in_stack_fffffffffffffe90 != *pvVar3,
                      (int3)in_stack_fffffffffffffe94);
      }
      if ((char)(in_stack_fffffffffffffe94 >> 0x18) == '\0') break;
      local_a4 = local_a4 + 1;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_4d + 5),(long)local_a4);
    *pvVar4 = *pvVar4 + 1;
  }
  local_c8 = 0x3f80000000000000;
  __n = &local_c9;
  std::allocator<double>::allocator((allocator<double> *)0x31dd73);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),(size_type)__n,
             (value_type_conflict6 *)in_stack_fffffffffffffe80,
             (allocator_type *)in_stack_fffffffffffffe78);
  std::allocator<double>::~allocator((allocator<double> *)0x31dda1);
  pAVar1 = (AssertionHandler *)chi_percentil(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  this_00 = pAVar1;
  operator____catch_sr
            ((char *)CONCAT17(in_stack_fffffffffffffe77,
                              CONCAT16(in_stack_fffffffffffffe76,
                                       CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                                      )),
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  this = (SourceLineInfo *)&stack0xfffffffffffffec0;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xc2);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)this);
  capturedExpression.m_size._0_4_ = in_stack_fffffffffffffe90;
  capturedExpression.m_start = __n;
  capturedExpression.m_size._4_4_ = in_stack_fffffffffffffe94;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))),
             capturedExpression,in_stack_fffffffffffffe6c);
  uVar5 = 0.01 < (double)pAVar1 && (double)pAVar1 < 0.99;
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            (this_01,(ExprLhs<bool> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
  ;
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(uVar5,CONCAT16(EVar2.m_lhs,
                                     CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)))
            );
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(uVar5,CONCAT16(EVar2.m_lhs,
                                     CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)))
            );
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)this_00);
  return;
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}